

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_path.cpp
# Opt level: O0

DWORD GetFullPathNameW(LPCWSTR lpFileName,DWORD nBufferLength,LPWSTR lpBuffer,LPWSTR *lpFilePart)

{
  long lVar1;
  size_t sVar2;
  CHAR *lpFileName_00;
  LPWSTR *lpWideCharStr;
  LPCWSTR lpWideCharStr_00;
  DWORD DVar3;
  int iVar4;
  char *lpBuffer_00;
  ulong uVar5;
  LPSTR lpMultiByteStr;
  long in_FS_OFFSET;
  undefined8 uStackY_100;
  CHAR aCStack_e8 [8];
  DWORD local_e0;
  int local_dc;
  DWORD local_d8;
  DWORD local_d4;
  DWORD local_d0;
  DWORD local_cc;
  char *local_c8;
  DWORD local_bc;
  DWORD local_b8;
  DWORD local_b4;
  DWORD local_b0;
  DWORD dwLastError;
  DWORD local_a0;
  uint local_9c;
  DWORD nRet;
  DWORD length;
  int srcSize;
  int fileNameLength;
  LPSTR lpFilePartA;
  size_t bufferASize;
  CHAR *bufferA;
  LPSTR fileNameA;
  LPWSTR *lpFilePart_local;
  LPWSTR lpBuffer_local;
  LPCWSTR pWStack_58;
  DWORD nBufferLength_local;
  LPCWSTR lpFileName_local;
  PathCharString bufferAPS;
  
  lpMultiByteStr = aCStack_e8;
  bufferAPS.m_count = *(SIZE_T *)(in_FS_OFFSET + 0x28);
  lpFilePartA = (LPSTR)0x0;
  fileNameA = (LPSTR)lpFilePart;
  lpFilePart_local = (LPWSTR *)lpBuffer;
  lpBuffer_local._4_4_ = nBufferLength;
  pWStack_58 = lpFileName;
  StackString<32UL,_char>::StackString((StackString<32UL,_char> *)&lpFileName_local);
  local_a0 = 0;
  if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
    abort();
  }
  uStackY_100 = 0x39c899;
  DVar3 = WideCharToMultiByte(0,0,pWStack_58,-1,(LPSTR)0x0,0,(LPCSTR)0x0,(LPBOOL)0x0);
  lpWideCharStr_00 = pWStack_58;
  local_b4 = DVar3;
  length = DVar3;
  if (DVar3 == 0) {
    SetLastError(0x57);
  }
  else {
    lVar1 = -((long)(int)DVar3 + 0xfU & 0xfffffffffffffff0);
    lpMultiByteStr = aCStack_e8 + lVar1;
    bufferA = lpMultiByteStr;
    *(undefined8 *)(&stack0xffffffffffffff10 + lVar1) = 0;
    *(undefined8 *)(&stack0xffffffffffffff08 + lVar1) = 0;
    *(undefined8 *)((long)&uStackY_100 + lVar1) = 0x39c93a;
    local_b8 = WideCharToMultiByte(0,0,lpWideCharStr_00,-1,lpMultiByteStr,DVar3,
                                   *(LPCSTR *)(&stack0xffffffffffffff08 + lVar1),
                                   *(LPBOOL *)(&stack0xffffffffffffff10 + lVar1));
    nRet = local_b8;
    if (local_b8 == 0) {
      *(undefined8 *)(&stack0xffffffffffffff10 + lVar1) = 0x39c964;
      local_bc = GetLastError();
      local_b0 = local_bc;
      if (local_bc == 0x7a) {
        if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
          *(undefined8 *)(&stack0xffffffffffffff10 + lVar1) = 0x39c995;
          abort();
        }
      }
      else {
        *(undefined8 *)(&stack0xffffffffffffff10 + lVar1) = 0x39c9c3;
        fprintf(_stderr,"] %s %s:%d","GetFullPathNameW",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/file/pal_path.cpp"
                ,0xf6);
        uVar5 = (ulong)local_b0;
        *(undefined8 *)(&stack0xffffffffffffff10 + lVar1) = 0x39c9e3;
        fprintf(_stderr,"WideCharToMultiByte failure! error is %d\n",uVar5);
      }
      *(undefined8 *)(&stack0xffffffffffffff10 + lVar1) = 0x39c9f1;
      SetLastError(0x57);
    }
    else {
      lpFilePartA = (LPSTR)(long)(MaxWCharToAcpLengthRatio << 10);
      *(undefined8 *)(&stack0xffffffffffffff10 + lVar1) = 0x39ca17;
      lpBuffer_00 = StackString<32UL,_char>::OpenStringBuffer
                              ((StackString<32UL,_char> *)&lpFileName_local,
                               (SIZE_T)(long)(MaxWCharToAcpLengthRatio << 10));
      lpFileName_00 = bufferA;
      local_c8 = lpBuffer_00;
      bufferASize = (size_t)lpBuffer_00;
      if (lpBuffer_00 == (char *)0x0) {
        *(undefined8 *)(&stack0xffffffffffffff10 + lVar1) = 0x39ca3d;
        SetLastError(8);
      }
      else {
        DVar3 = (DWORD)lpFilePartA;
        *(undefined8 *)(&stack0xffffffffffffff10 + lVar1) = 0x39ca5b;
        local_cc = GetFullPathNameA(lpFileName_00,DVar3,lpBuffer_00,(LPSTR *)&srcSize);
        uVar5 = (ulong)local_cc;
        local_9c = local_cc;
        *(undefined8 *)(&stack0xffffffffffffff10 + lVar1) = 0x39ca80;
        StackString<32UL,_char>::CloseBuffer((StackString<32UL,_char> *)&lpFileName_local,uVar5);
        DVar3 = lpBuffer_local._4_4_;
        lpWideCharStr = lpFilePart_local;
        sVar2 = bufferASize;
        if ((local_9c == 0) || (lpFilePartA < (LPSTR)(ulong)local_9c)) {
          local_a0 = local_9c;
        }
        else {
          *(undefined8 *)(&stack0xffffffffffffff10 + lVar1) = 0x39cac2;
          local_d0 = MultiByteToWideChar(0,0,(LPCSTR)sVar2,-1,(LPWSTR)lpWideCharStr,DVar3);
          sVar2 = bufferASize;
          if (local_d0 == 0) {
            local_a0 = local_d0;
            *(undefined8 *)(&stack0xffffffffffffff10 + lVar1) = 0x39cae4;
            local_d4 = GetLastError();
            sVar2 = bufferASize;
            if (local_d4 == 0x7a) {
              *(undefined8 *)(&stack0xffffffffffffff10 + lVar1) = 0x39cb14;
              local_d8 = MultiByteToWideChar(0,0,(LPCSTR)sVar2,-1,(LPWSTR)0x0,0);
              local_a0 = local_d8;
              *(undefined8 *)(&stack0xffffffffffffff10 + lVar1) = 0x39cb32;
              SetLastError(0x6f);
            }
          }
          else {
            local_a0 = local_d0 - 1;
            if (fileNameA != (LPSTR)0x0) {
              *(LPWSTR **)fileNameA = lpFilePart_local;
              iVar4 = (int)bufferASize;
              *(undefined8 *)(&stack0xffffffffffffff10 + lVar1) = 0x39cb78;
              local_dc = MultiByteToWideChar(0,0,(LPCSTR)sVar2,srcSize - iVar4,(LPWSTR)0x0,0);
              *(long *)fileNameA = *(long *)fileNameA + (long)local_dc * 2;
            }
          }
        }
      }
    }
  }
  if ((PAL_InitializeChakraCoreCalled & 1U) != 0) {
    local_e0 = local_a0;
    lpMultiByteStr[-8] = -0x3f;
    lpMultiByteStr[-7] = -0x35;
    lpMultiByteStr[-6] = '9';
    lpMultiByteStr[-5] = '\0';
    lpMultiByteStr[-4] = '\0';
    lpMultiByteStr[-3] = '\0';
    lpMultiByteStr[-2] = '\0';
    lpMultiByteStr[-1] = '\0';
    StackString<32UL,_char>::~StackString((StackString<32UL,_char> *)&lpFileName_local);
    if (*(SIZE_T *)(in_FS_OFFSET + 0x28) != bufferAPS.m_count) {
      lpMultiByteStr[-8] = '\x0f';
      lpMultiByteStr[-7] = -0x34;
      lpMultiByteStr[-6] = '9';
      lpMultiByteStr[-5] = '\0';
      lpMultiByteStr[-4] = '\0';
      lpMultiByteStr[-3] = '\0';
      lpMultiByteStr[-2] = '\0';
      lpMultiByteStr[-1] = '\0';
      __stack_chk_fail();
    }
    return local_e0;
  }
  lpMultiByteStr[-8] = -0x54;
  lpMultiByteStr[-7] = -0x35;
  lpMultiByteStr[-6] = '9';
  lpMultiByteStr[-5] = '\0';
  lpMultiByteStr[-4] = '\0';
  lpMultiByteStr[-3] = '\0';
  lpMultiByteStr[-2] = '\0';
  lpMultiByteStr[-1] = '\0';
  abort();
}

Assistant:

DWORD
PALAPI
GetFullPathNameW(
     IN LPCWSTR lpFileName,
     IN DWORD nBufferLength,
     OUT LPWSTR lpBuffer,
     OUT LPWSTR *lpFilePart)
{
    LPSTR fileNameA;
    /* bufferA needs to be able to hold a path that's potentially as
       large as MAX_LONGPATH WCHARs. */
    CHAR * bufferA;
    size_t bufferASize = 0;
    PathCharString bufferAPS;
    LPSTR lpFilePartA;
    int   fileNameLength;
    int   srcSize;
    DWORD length;
    DWORD nRet = 0;

    PERF_ENTRY(GetFullPathNameW);
    ENTRY("GetFullPathNameW(lpFileName=%p (%S), nBufferLength=%u, lpBuffer=%p"
          ", lpFilePart=%p)\n",
          lpFileName?lpFileName:W16_NULLSTRING,
          lpFileName?lpFileName:W16_NULLSTRING, nBufferLength,
          lpBuffer, lpFilePart);

    /* Find the number of bytes required to convert lpFileName
       to ANSI. This may be more than MAX_LONGPATH. We try to
       handle that case, since it may be less than MAX_LONGPATH
       WCHARs. */

    fileNameLength = WideCharToMultiByte(CP_ACP, 0, lpFileName,
                                         -1, NULL, 0, NULL, NULL);
    if (fileNameLength == 0)
    {
        /* Couldn't convert to ANSI. That's odd. */
        SetLastError(ERROR_INVALID_PARAMETER);
        goto done;
    }
    else
    {
        fileNameA = static_cast<LPSTR>(alloca(fileNameLength));
    }

    /* Now convert lpFileName to ANSI. */
    srcSize = WideCharToMultiByte (CP_ACP, 0, lpFileName,
                                   -1, fileNameA, fileNameLength,
                                   NULL, NULL );
    if( srcSize == 0 )
    {
        DWORD dwLastError = GetLastError();
        if( dwLastError == ERROR_INSUFFICIENT_BUFFER )
        {
            ERROR("lpFileName is larger than MAX_LONGPATH (%d)!\n", MAX_LONGPATH);
        }
        else
        {
            ASSERT("WideCharToMultiByte failure! error is %d\n", dwLastError);
        }
        SetLastError(ERROR_INVALID_PARAMETER);
        goto done;
    }

    bufferASize = MAX_LONGPATH * MaxWCharToAcpLengthRatio;
    bufferA = bufferAPS.OpenStringBuffer(bufferASize);
    if (NULL == bufferA)
    {
        SetLastError(ERROR_NOT_ENOUGH_MEMORY);
        goto done;
    }
    length = GetFullPathNameA(fileNameA, bufferASize, bufferA, &lpFilePartA);
    bufferAPS.CloseBuffer(length);

    if (length == 0 || length > bufferASize)
    {
        /* Last error is set by GetFullPathNameA */
        nRet = length;
        goto done;
    }

    /* Convert back to Unicode the result */
    nRet = MultiByteToWideChar( CP_ACP, 0, bufferA, -1,
                                lpBuffer, nBufferLength );

    if (nRet == 0)
    {
        if ( GetLastError() == ERROR_INSUFFICIENT_BUFFER )
        {
            /* get the required length */
            nRet = MultiByteToWideChar( CP_ACP, 0, bufferA, -1,
                                        NULL, 0 );
            SetLastError(ERROR_BUFFER_OVERFLOW);
        }

        goto done;
    }

    /* MultiByteToWideChar counts the trailing NULL, but
       GetFullPathName does not. */
    nRet--;

    /* now set lpFilePart */
    if (lpFilePart != NULL)
    {
        *lpFilePart = lpBuffer;
        *lpFilePart += MultiByteToWideChar( CP_ACP, 0, bufferA,
                                            lpFilePartA - bufferA, NULL, 0);
    }

done:
    LOGEXIT("GetFullPathNameW returns DWORD %u\n", nRet);
    PERF_EXIT(GetFullPathNameW);
    return nRet;
}